

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
accept<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,mpl_::bool_<false>>>,mpl_::bool_<false>>
          (xpression_peeker<char> *this,
          simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_mpl_::bool_<false>_>_>,_mpl_::bool_<false>_>
          *xpr)

{
  hash_peek_bitset<char> *this_00;
  
  this_00 = this->bset_;
  if (xpr->min_ != 0) {
    hash_peek_bitset<char>::
    set_char<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (this_00,(xpr->xpr_).
                       super_literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_mpl_::bool_<false>_>
                       .ch_,true,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)this->traits_);
    return;
  }
  this_00->icase_ = false;
  *(undefined4 *)(this_00->bset_).super__Base_bitset<4UL>._M_w = 0xffffffff;
  *(undefined4 *)((long)(this_00->bset_).super__Base_bitset<4UL>._M_w + 4) = 0xffffffff;
  *(undefined4 *)((this_00->bset_).super__Base_bitset<4UL>._M_w + 1) = 0xffffffff;
  *(undefined4 *)((long)(this_00->bset_).super__Base_bitset<4UL>._M_w + 0xc) = 0xffffffff;
  *(undefined4 *)((this_00->bset_).super__Base_bitset<4UL>._M_w + 2) = 0xffffffff;
  *(undefined4 *)((long)(this_00->bset_).super__Base_bitset<4UL>._M_w + 0x14) = 0xffffffff;
  *(undefined4 *)((this_00->bset_).super__Base_bitset<4UL>._M_w + 3) = 0xffffffff;
  *(undefined4 *)((long)(this_00->bset_).super__Base_bitset<4UL>._M_w + 0x1c) = 0xffffffff;
  return;
}

Assistant:

mpl::false_ accept(simple_repeat_matcher<Xpr, Greedy> const &xpr)
    {
        if(Greedy() && 1U == xpr.width_)
        {
            ++this->leading_simple_repeat_;
            xpr.leading_ = this->leading_simple_repeat();
        }
        0 != xpr.min_ ? xpr.xpr_.peek(*this) : this->fail(); // could be a union of xpr and next
        return mpl::false_();
    }